

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.hxx
# Opt level: O2

void __thiscall rosgraph_msgs::Log_<std::allocator<void>_>::Log_(Log_<std::allocator<void>_> *this)

{
  (this->header).seq = 0;
  (this->header).stamp.super_TimeBase<miniros::Time,_miniros::Duration>.sec = 0;
  (this->header).stamp.super_TimeBase<miniros::Time,_miniros::Duration>.nsec = 0;
  (this->header).frame_id._M_dataplus._M_p = (pointer)&(this->header).frame_id.field_2;
  (this->header).frame_id._M_string_length = 0;
  (this->header).frame_id.field_2._M_local_buf[0] = '\0';
  this->level = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  (this->file)._M_dataplus._M_p = (pointer)&(this->file).field_2;
  (this->file)._M_string_length = 0;
  (this->file).field_2._M_local_buf[0] = '\0';
  (this->function)._M_dataplus._M_p = (pointer)&(this->function).field_2;
  (this->function)._M_string_length = 0;
  (this->function).field_2._M_local_buf[0] = '\0';
  this->line = 0;
  (this->topics).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->topics).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->topics).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Header_()
    : seq(0)
    , stamp()
    , frame_id()  {
    }